

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool __thiscall
absl::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  uint uVar1;
  undefined8 extraout_RAX;
  wchar_t *pwVar2;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  CVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  FormatSinkImpl *this_00;
  byte bVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  string_view value;
  string_view v_00;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  Storage local_140;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_);
  local_140.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_0UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((long)v * 4);
  local_140.data_ =
       FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
                 (&local_140);
  bVar10 = v != (wchar_t *)0x0;
  if (v == (wchar_t *)0x0) {
    CVar3.super_Storage<unsigned_long,_0UL,_false>.value = (Storage<unsigned_long,_0UL,_false>)0;
  }
  else {
    CVar3.super_Storage<unsigned_long,_0UL,_false>.value = (Storage<unsigned_long,_0UL,_false>)0;
    bVar4 = 0;
    bVar5 = false;
    pwVar2 = (wchar_t *)0x1;
    do {
      if ((ulong)local_140.size_alloc_.
                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                 .super_Storage<unsigned_long,_0UL,_false>.value <=
          (ulong)CVar3.super_Storage<unsigned_long,_0UL,_false>.value) {
        _GLOBAL__N_1::ConvertStringArg();
        if (0x100 < (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value) {
          operator_delete(local_140.data_,
                          (ulong)local_140.size_alloc_.
                                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                                 .super_Storage<unsigned_long,_0UL,_false>.value);
        }
        _Unwind_Resume(extraout_RAX);
      }
      uVar1 = *(uint *)(this + (long)pwVar2 * 4 + -4);
      bVar7 = (byte)uVar1;
      if (uVar1 < 0x80) {
        local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] = bVar7;
        lVar9 = 1;
LAB_0019960e:
        bVar11 = false;
      }
      else {
        if (uVar1 < 0x800) {
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 6) | 0xc0;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               bVar7 & 0x3f | 0x80;
          lVar9 = 2;
          goto LAB_0019960e;
        }
        if (uVar1 < 0xd800 || (uVar1 & 0xffffe000) == 0xe000) {
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 0xc) | 0xe0;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
               bVar7 & 0x3f | 0x80;
          lVar9 = 3;
          goto LAB_0019960e;
        }
        if (uVar1 - 0x10000 < 0x100000) {
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 0x12) | 0xf0;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 2] =
               (byte)(uVar1 >> 6) & 0x3f | 0x80;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 3] =
               bVar7 & 0x3f | 0x80;
          lVar9 = 4;
          goto LAB_0019960e;
        }
        if (uVar1 < 0xdc00) {
          bVar4 = bVar7 & 3;
          uVar6 = (uVar1 >> 6 & 0xf) + 1;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)uVar6 >> 2 | 0xf0;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               (byte)(uVar1 >> 2) & 0xf | (byte)((uVar6 & 3) << 4) | 0x80;
          lVar9 = 2;
          bVar5 = true;
          goto LAB_0019960e;
        }
        lVar9 = -1;
        bVar11 = true;
        if ((uVar1 < 0xe000) && (bVar5)) {
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value] =
               (byte)(uVar1 >> 6) & 0xf | bVar4 << 4 | 0x80;
          local_140.data_[(long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + 1] =
               bVar7 & 0x3f | 0x80;
          lVar9 = 2;
          bVar5 = false;
          bVar4 = 0;
          goto LAB_0019960e;
        }
      }
      lVar8 = 0;
      if (!bVar11) {
        lVar8 = lVar9;
      }
      CVar3.super_Storage<unsigned_long,_0UL,_false>.value =
           (Storage<unsigned_long,_0UL,_false>)
           ((long)CVar3.super_Storage<unsigned_long,_0UL,_false>.value + lVar8);
      if (bVar11) break;
      bVar10 = pwVar2 < v;
      bVar11 = pwVar2 != v;
      pwVar2 = (wchar_t *)((long)pwVar2 + 1);
    } while (bVar11);
  }
  if (bVar10) {
    bVar10 = false;
  }
  else {
    bVar4 = (byte)(len >> 8);
    if (bVar4 == 0) {
      bVar10 = true;
      v_00._M_str = local_140.data_;
      v_00._M_len = (size_t)CVar3.super_Storage<unsigned_long,_0UL,_false>.value;
      FormatSinkImpl::Append(this_00,v_00);
    }
    else {
      value._M_str = local_140.data_;
      value._M_len = (size_t)CVar3.super_Storage<unsigned_long,_0UL,_false>.value;
      bVar10 = FormatSinkImpl::PutPaddedString
                         (this_00,value,(int)(len >> 0x20),conv._0_4_,(bool)(bVar4 & 1));
    }
  }
  if (0x100 < (ulong)local_140.size_alloc_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                     .super_Storage<unsigned_long,_0UL,_false>.value) {
    operator_delete(local_140.data_,
                    (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value);
  }
  return bVar10;
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}